

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O3

DescVector * llvm::getDescriptions(void)

{
  long lVar1;
  DescVector *pDVar2;
  
  getOpDesc(unsigned_int)::Descriptions = (DescVector *)0x0;
  DAT_010b2e78 = 0;
  _DAT_010b2e80 = 0;
  std::
  vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ::resize((vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
            *)&getOpDesc(unsigned_int)::Descriptions,0xff);
  pDVar2 = getOpDesc(unsigned_int)::Descriptions;
  *(undefined2 *)
   ((long)&(getOpDesc(unsigned_int)::Descriptions->
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           )._M_impl.super__Vector_impl_data._M_finish + 1) = 0x502;
  *(undefined1 *)
   ((long)&(pDVar2->
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           )._M_impl.super__Vector_impl_data._M_finish + 3) = 0xff;
  *(undefined2 *)
   ((long)&(pDVar2->
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0xff02;
  *(undefined1 *)
   ((long)&(pDVar2->
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0xff;
  pDVar2[1].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x102ff8002ff0002;
  pDVar2[1].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2ff0202ff8102ff;
  pDVar2[1].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xff8302ff0302ff82;
  pDVar2[2].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xff02ff8402ff0402;
  pDVar2[2].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2ffff02ffff02ff;
  pDVar2[2].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffff02ffff02ff00;
  pDVar2[3].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xff02ffff02ffff02;
  pDVar2[3].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2ffff02ffff02ff;
  pDVar2[3].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffff02ffff02ffff;
  pDVar2[4].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xff02ffff02ffff02;
  pDVar2[4].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2ffff02ff0402ff;
  pDVar2[4].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffff02ffff02ffff;
  pDVar2 = getOpDesc(unsigned_int)::Descriptions;
  getOpDesc(unsigned_int)::Descriptions[5].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xff02ffff02ff8102;
  pDVar2[5].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2ffff02ffff02ff;
  pDVar2[5].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xff8102ffff02ffff;
  lVar1 = 0;
  do {
    pDVar2 = getOpDesc(unsigned_int)::Descriptions;
    *(undefined2 *)
     ((long)&getOpDesc(unsigned_int)::Descriptions[6].
             super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar1) = 0xff02;
    *(undefined1 *)
     ((long)&pDVar2[6].
             super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar1 + 2) = 0xff;
    lVar1 = lVar1 + 3;
  } while (lVar1 != 0x60);
  lVar1 = 0;
  do {
    pDVar2 = getOpDesc(unsigned_int)::Descriptions;
    *(undefined2 *)
     ((long)&getOpDesc(unsigned_int)::Descriptions[10].
             super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar1) = 0xff02;
    *(undefined1 *)
     ((long)&pDVar2[10].
             super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar1 + 2) = 0xff;
    lVar1 = lVar1 + 3;
  } while (lVar1 != 0x60);
  lVar1 = 0;
  do {
    pDVar2 = getOpDesc(unsigned_int)::Descriptions;
    *(undefined2 *)
     ((long)&getOpDesc(unsigned_int)::Descriptions[0xe].
             super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar1) = 0x8402;
    *(undefined1 *)
     ((long)&pDVar2[0xe].
             super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar1 + 2) = 0xff;
    pDVar2 = getOpDesc(unsigned_int)::Descriptions;
    lVar1 = lVar1 + 3;
  } while (lVar1 != 0x60);
  getOpDesc(unsigned_int)::Descriptions[0x12].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x402ff8402ff0402;
  pDVar2[0x12].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2ff0002ff040284;
  pDVar2[0x12].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffff03ffff02ff00;
  pDVar2[0x13].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x603ff0203ff0103;
  pDVar2[0x13].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ffff03ffff03ff;
  pDVar2[0x13].
  super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffff030704030404;
  *(undefined2 *)
   ((long)&pDVar2[0x1d].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_finish + 7) = 0x404;
  *(undefined1 *)
   ((long)&pDVar2[0x1d].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0x84;
  *(undefined2 *)
   &pDVar2[0x1c].
    super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
    ._M_impl.super__Vector_impl_data._M_start = 0xff03;
  *(undefined1 *)
   ((long)&pDVar2[0x1c].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_start + 2) = 0xff;
  *(undefined2 *)
   ((long)&pDVar2[0x14].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_start + 3) = 0x404;
  *(undefined1 *)
   ((long)&pDVar2[0x14].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_start + 5) = 0xff;
  *(undefined4 *)
   ((long)&pDVar2[0x1f].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0x4ff0404;
  *(undefined2 *)
   ((long)&pDVar2[0x1f].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_finish + 5) = 0xff04;
  *(undefined2 *)
   ((long)&pDVar2[0x1e].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0x404;
  *(undefined1 *)
   ((long)&pDVar2[0x1e].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_finish + 3) = 0xff;
  *(undefined2 *)
   &pDVar2[0x15].
    super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
    ._M_impl.super__Vector_impl_data._M_start = 0x805;
  *(undefined1 *)
   ((long)&pDVar2[0x15].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_start + 2) = 0xff;
  *(undefined2 *)
   ((long)&pDVar2[0x14].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0x405;
  *(undefined1 *)
   ((long)&pDVar2[0x14].
           super__Vector_base<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ._M_impl.super__Vector_impl_data._M_finish + 3) = 0xff;
  return pDVar2;
}

Assistant:

static DescVector getDescriptions() {
  DescVector Descriptions;
  typedef DWARFExpression::Operation Op;
  typedef Op::Description Desc;

  Descriptions.resize(0xff);
  Descriptions[DW_OP_addr] = Desc(Op::Dwarf2, Op::SizeAddr);
  Descriptions[DW_OP_deref] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_const1u] = Desc(Op::Dwarf2, Op::Size1);
  Descriptions[DW_OP_const1s] = Desc(Op::Dwarf2, Op::SignedSize1);
  Descriptions[DW_OP_const2u] = Desc(Op::Dwarf2, Op::Size2);
  Descriptions[DW_OP_const2s] = Desc(Op::Dwarf2, Op::SignedSize2);
  Descriptions[DW_OP_const4u] = Desc(Op::Dwarf2, Op::Size4);
  Descriptions[DW_OP_const4s] = Desc(Op::Dwarf2, Op::SignedSize4);
  Descriptions[DW_OP_const8u] = Desc(Op::Dwarf2, Op::Size8);
  Descriptions[DW_OP_const8s] = Desc(Op::Dwarf2, Op::SignedSize8);
  Descriptions[DW_OP_constu] = Desc(Op::Dwarf2, Op::SizeLEB);
  Descriptions[DW_OP_consts] = Desc(Op::Dwarf2, Op::SignedSizeLEB);
  Descriptions[DW_OP_dup] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_drop] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_over] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_pick] = Desc(Op::Dwarf2, Op::Size1);
  Descriptions[DW_OP_swap] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_rot] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_xderef] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_abs] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_and] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_div] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_minus] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_mod] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_mul] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_neg] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_not] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_or] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_plus] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_plus_uconst] = Desc(Op::Dwarf2, Op::SizeLEB);
  Descriptions[DW_OP_shl] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_shr] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_shra] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_xor] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_skip] = Desc(Op::Dwarf2, Op::SignedSize2);
  Descriptions[DW_OP_bra] = Desc(Op::Dwarf2, Op::SignedSize2);
  Descriptions[DW_OP_eq] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_ge] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_gt] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_le] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_lt] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_ne] = Desc(Op::Dwarf2);
  for (uint16_t LA = DW_OP_lit0; LA <= DW_OP_lit31; ++LA)
    Descriptions[LA] = Desc(Op::Dwarf2);
  for (uint16_t LA = DW_OP_reg0; LA <= DW_OP_reg31; ++LA)
    Descriptions[LA] = Desc(Op::Dwarf2);
  for (uint16_t LA = DW_OP_breg0; LA <= DW_OP_breg31; ++LA)
    Descriptions[LA] = Desc(Op::Dwarf2, Op::SignedSizeLEB);
  Descriptions[DW_OP_regx] = Desc(Op::Dwarf2, Op::SizeLEB);
  Descriptions[DW_OP_fbreg] = Desc(Op::Dwarf2, Op::SignedSizeLEB);
  Descriptions[DW_OP_bregx] = Desc(Op::Dwarf2, Op::SizeLEB, Op::SignedSizeLEB);
  Descriptions[DW_OP_piece] = Desc(Op::Dwarf2, Op::SizeLEB);
  Descriptions[DW_OP_deref_size] = Desc(Op::Dwarf2, Op::Size1);
  Descriptions[DW_OP_xderef_size] = Desc(Op::Dwarf2, Op::Size1);
  Descriptions[DW_OP_nop] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_push_object_address] = Desc(Op::Dwarf3);
  Descriptions[DW_OP_call2] = Desc(Op::Dwarf3, Op::Size2);
  Descriptions[DW_OP_call4] = Desc(Op::Dwarf3, Op::Size4);
  Descriptions[DW_OP_call_ref] = Desc(Op::Dwarf3, Op::SizeRefAddr);
  Descriptions[DW_OP_form_tls_address] = Desc(Op::Dwarf3);
  Descriptions[DW_OP_call_frame_cfa] = Desc(Op::Dwarf3);
  Descriptions[DW_OP_bit_piece] = Desc(Op::Dwarf3, Op::SizeLEB, Op::SizeLEB);
  Descriptions[DW_OP_implicit_value] =
      Desc(Op::Dwarf3, Op::SizeLEB, Op::SizeBlock);
  Descriptions[DW_OP_stack_value] = Desc(Op::Dwarf3);
  Descriptions[DW_OP_WASM_location] =
      Desc(Op::Dwarf4, Op::SizeLEB, Op::SignedSizeLEB);
  Descriptions[DW_OP_GNU_push_tls_address] = Desc(Op::Dwarf3);
  Descriptions[DW_OP_addrx] = Desc(Op::Dwarf4, Op::SizeLEB);
  Descriptions[DW_OP_GNU_addr_index] = Desc(Op::Dwarf4, Op::SizeLEB);
  Descriptions[DW_OP_GNU_const_index] = Desc(Op::Dwarf4, Op::SizeLEB);
  Descriptions[DW_OP_GNU_entry_value] = Desc(Op::Dwarf4, Op::SizeLEB);

  Descriptions[DW_OP_convert] = Desc(Op::Dwarf5, Op::BaseTypeRef);
  Descriptions[DW_OP_entry_value] = Desc(Op::Dwarf5, Op::SizeLEB);

  return Descriptions;
}